

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Vector<float,_4>_>::operator()
          (InputLess<tcu::Vector<float,_4>_> *this,Vector<float,_4> *vec1,Vector<float,_4> *vec2)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  int local_2c;
  int ndx;
  Vector<float,_4> *vec2_local;
  Vector<float,_4> *vec1_local;
  InputLess<tcu::Vector<float,_4>_> *this_local;
  
  local_2c = 0;
  while( true ) {
    if (3 < local_2c) {
      return false;
    }
    pfVar2 = tcu::Vector<float,_4>::operator[](vec1,local_2c);
    pfVar3 = tcu::Vector<float,_4>::operator[](vec2,local_2c);
    bVar1 = inputLess<float>(pfVar2,pfVar3);
    if (bVar1) break;
    pfVar2 = tcu::Vector<float,_4>::operator[](vec2,local_2c);
    pfVar3 = tcu::Vector<float,_4>::operator[](vec1,local_2c);
    bVar1 = inputLess<float>(pfVar2,pfVar3);
    if (bVar1) {
      return false;
    }
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool operator() (const Vector<T, Size>& vec1, const Vector<T, Size>& vec2) const
	{
		for (int ndx = 0; ndx < Size; ++ndx)
		{
			if (inputLess(vec1[ndx], vec2[ndx]))
				return true;
			if (inputLess(vec2[ndx], vec1[ndx]))
				return false;
		}

		return false;
	}